

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_checker.c
# Opt level: O3

uint8_t cio_check_utf8(cio_utf8_state *state,uint8_t *string,size_t count)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint8_t *puVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  byte bVar10;
  undefined8 local_28;
  uint8_t buffer [8];
  
  if (count < 8) {
    uVar9 = 0;
    uVar3 = (uint)count;
    uVar6 = 0;
    uVar7 = count;
  }
  else {
    uVar3 = -(int)string & 7;
    uVar7 = count - uVar3;
    uVar9 = uVar7 >> 3;
    uVar6 = (uint)uVar7 & 7;
    uVar7 = (ulong)uVar3;
  }
  if (uVar3 != 0) {
    bVar10 = state->codepoint;
    bVar8 = state->state;
    lVar5 = 0;
    do {
      bVar1 = string[lVar5];
      bVar2 = ""[bVar1];
      if (bVar8 == 0) {
        bVar10 = (byte)(0xff >> (bVar2 & 0x1f)) & bVar1;
      }
      else {
        bVar10 = bVar10 << 6 | bVar1 & 0x3f;
      }
      state->codepoint = bVar10;
      bVar8 = ""[(ulong)bVar2 + (ulong)bVar8 + 0x100];
      state->state = bVar8;
      if (bVar8 == 0xc) {
        return '\f';
      }
      lVar5 = lVar5 + 1;
    } while (uVar3 != (uint)lVar5);
  }
  if (uVar9 != 0) {
    puVar4 = string + uVar7;
    bVar10 = state->codepoint;
    bVar8 = state->state;
    do {
      uVar9 = uVar9 - 1;
      local_28 = *(undefined8 *)puVar4;
      puVar4 = puVar4 + 8;
      lVar5 = 0;
      do {
        bVar1 = *(byte *)((long)&local_28 + lVar5);
        if (bVar8 == 0) {
          bVar10 = (byte)(0xff >> (""[bVar1] & 0x1f)) & bVar1;
        }
        else {
          bVar10 = bVar10 << 6 | bVar1 & 0x3f;
        }
        bVar8 = ""[(ulong)""[bVar1] + (ulong)bVar8 + 0x100];
        if (bVar8 == 0xc) {
          state->state = '\f';
          state->codepoint = bVar10;
          return '\f';
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 8);
      state->state = bVar8;
      state->codepoint = bVar10;
    } while (uVar9 != 0);
  }
  if (uVar6 == 0) {
    bVar10 = state->state;
  }
  else {
    bVar8 = state->codepoint;
    bVar10 = state->state;
    lVar5 = 0;
    do {
      bVar1 = string[lVar5 + (count - uVar6)];
      bVar2 = ""[bVar1];
      if (bVar10 == 0) {
        bVar8 = (byte)(0xff >> (bVar2 & 0x1f)) & bVar1;
      }
      else {
        bVar8 = bVar8 << 6 | bVar1 & 0x3f;
      }
      state->codepoint = bVar8;
      bVar10 = ""[(ulong)bVar2 + (ulong)bVar10 + 0x100];
      state->state = bVar10;
      if (bVar10 == 0xc) {
        return '\f';
      }
      lVar5 = lVar5 + 1;
    } while (uVar6 != (uint)lVar5);
  }
  return bVar10;
}

Assistant:

uint8_t cio_check_utf8(struct cio_utf8_state *state, const uint8_t *string, size_t count)
{
	const uint_fast32_t *s_aligned = NULL;
	unsigned int pre_length = (unsigned int)count;
	size_t main_length = 0;
	unsigned int post_length = 0;

	if (count >= sizeof(*s_aligned)) {
		pre_length = ((uintptr_t)string) % sizeof(*s_aligned);
		pre_length = (sizeof(*s_aligned) - pre_length) % sizeof(*s_aligned);
		main_length = (count - pre_length) / sizeof(*s_aligned);
		post_length = (unsigned int)(count - pre_length - (main_length * sizeof(*s_aligned)));
	}

	s_aligned = (const void *)(string + pre_length);

	size_t i_p = 0;
	while (pre_length > 0) {
		if (decode(&state->state, &state->codepoint, string[i_p]) == CIO_UTF8_REJECT) {
			return CIO_UTF8_REJECT;
		}

		pre_length--;
		i_p++;
	}

	while (main_length-- > 0) {
		uint8_t buffer[sizeof(uint_fast32_t)];
		memcpy(buffer, s_aligned, sizeof(buffer));
		s_aligned++;
		for (uint_fast8_t i = 0; i < (uint_fast8_t)sizeof(buffer); i++) {
			uint8_t character = buffer[i];
			if (decode(&state->state, &state->codepoint, character) == CIO_UTF8_REJECT) {
				return CIO_UTF8_REJECT;
			}
		}
	}

	i_p = count - post_length;
	while (post_length > 0) {
		if (decode(&state->state, &state->codepoint, string[i_p]) == CIO_UTF8_REJECT) {
			return CIO_UTF8_REJECT;
		}

		post_length--;
		i_p++;
	}

	return state->state;
}